

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::drawSurface
          (SeparateShaderTest *this,Surface *dst,deUint32 seed)

{
  CallLogWrapper *this_00;
  RenderContext *context;
  int iVar1;
  int x;
  int iVar2;
  int iVar3;
  GLenum err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int width;
  Random rnd;
  PixelBufferAccess local_58;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  if (seed == 0) {
    seed = deRandom_getUint32(&(this->m_rnd).m_rnd);
  }
  deRandom_init(&rnd.m_rnd,seed);
  iVar1 = (*context->_vptr_RenderContext[4])(context);
  iVar2 = *(int *)CONCAT44(extraout_var,iVar1);
  width = 0x80;
  if (iVar2 < 0x80) {
    width = iVar2;
  }
  x = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar2 - width);
  iVar2 = ((int *)CONCAT44(extraout_var,iVar1))[1];
  iVar1 = 0x80;
  if (iVar2 < 0x80) {
    iVar1 = iVar2;
  }
  iVar2 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar2 - iVar1);
  this_00 = &this->super_CallLogWrapper;
  glu::CallLogWrapper::glClearColor(this_00,0.125,0.25,0.5,1.0);
  iVar3 = (*context->_vptr_RenderContext[3])(context);
  (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x1a00))(x,iVar2,width,iVar1);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
  err = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(err,"glDrawArrays(GL_TRIANGLES, 0, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x52a);
  tcu::Surface::setSize(dst,width,iVar1);
  tcu::Surface::getAccess(&local_58,dst);
  glu::readPixels(context,x,iVar2,&local_58);
  tcu::TestLog::writeMessage
            (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             "// Drew a triangle");
  return;
}

Assistant:

void SeparateShaderTest::drawSurface (Surface& dst, deUint32 seed)
{
	const RenderContext&	renderCtx	= getRenderContext();
	Random					rnd			(seed > 0 ? seed : m_rnd.getUint32());
	Rectangle				viewport	= randomViewport(renderCtx, rnd,
														 VIEWPORT_SIZE, VIEWPORT_SIZE);
	glClearColor(0.125f, 0.25f, 0.5f, 1.f);
	setViewport(renderCtx, viewport);
	glClear(GL_COLOR_BUFFER_BIT);
	GLU_CHECK_CALL(glDrawArrays(GL_TRIANGLES, 0, 3));
	readRectangle(renderCtx, viewport, dst);
	log().writeMessage("// Drew a triangle");
}